

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

char * loadFile(string *file)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  double __x;
  undefined1 local_260 [8];
  ifstream fin;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_58,".",(allocator *)local_260);
  bVar1 = fileExists(file,false,&local_58,0);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    std::ifstream::ifstream(local_260,(file->_M_dataplus)._M_p,_S_in|_S_bin);
    iVar2 = std::istream::tellg();
    std::istream::seekg((long)local_260,_S_beg);
    iVar3 = std::istream::tellg();
    uVar5 = 0xffffffffffffffff;
    if (-1 < (long)(iVar3 - iVar2)) {
      uVar5 = (long)(iVar3 - iVar2);
    }
    pcVar4 = (char *)operator_new__(uVar5);
    std::istream::seekg(local_260,0,0);
    std::istream::read(local_260,(long)pcVar4);
    std::ifstream::close();
    std::ifstream::~ifstream(local_260);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   "file does not exist ",file);
    std::operator+(&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                   "\n");
    log(__x);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)local_260);
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

char * loadFile( string file )
{
	if (!fileExists(file))
	{
		log("file does not exist " + file + "\n");
		return NULL;
	}
	ifstream fin(file.c_str(), ifstream::in|ios::binary);
	int begin = fin.tellg();
	fin.seekg (0, ios::end);
	int size = (int)fin.tellg() - begin;
	char * buffer = new char[size];
	fin.seekg(0);
	fin.read(buffer, size);
	fin.close();
	//println("read " + str(size));
	return buffer;
}